

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

int __thiscall
Fl_Pixmap::prepare(Fl_Pixmap *this,int XP,int YP,int WP,int HP,int *cx,int *cy,int *X,int *Y,int *W,
                  int *H)

{
  undefined8 uVar1;
  Display *pDVar2;
  int YP_00;
  int XP_00;
  int iVar3;
  int w;
  int h;
  int iVar4;
  uint uVar5;
  Fl_Display_Device *pFVar6;
  char **cdata;
  Fl_Bitmask FVar7;
  uchar *local_70;
  uchar *bitmap;
  Fl_Surface_Device *_ss;
  Window _sw;
  int *piStack_50;
  int code;
  int *cx_local;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Pixmap *this_local;
  
  piStack_50 = cx;
  cx_local._0_4_ = HP;
  cx_local._4_4_ = WP;
  HP_local = YP;
  WP_local = XP;
  _YP_local = this;
  iVar3 = Fl_Image::w(&this->super_Fl_Image);
  if (iVar3 < 0) {
    measure(this);
  }
  XP_00 = WP_local;
  YP_00 = HP_local;
  iVar4 = cx_local._4_4_;
  iVar3 = (int)cx_local;
  w = Fl_Image::w(&this->super_Fl_Image);
  h = Fl_Image::h(&this->super_Fl_Image);
  _sw._4_4_ = ::start(this,XP_00,YP_00,iVar4,iVar3,w,h,piStack_50,cy,X,Y,W,H);
  pDVar2 = fl_display;
  if (_sw._4_4_ == 0) {
    if (this->id_ == 0) {
      uVar1 = *(undefined8 *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
      iVar3 = Fl_Image::w(&this->super_Fl_Image);
      iVar4 = Fl_Image::h(&this->super_Fl_Image);
      uVar5 = XCreatePixmap(pDVar2,uVar1,iVar3,iVar4,fl_visual->depth);
      this->id_ = uVar5;
      _ss = (Fl_Surface_Device *)fl_window;
      fl_window = (Window)this->id_;
      bitmap = (uchar *)Fl_Surface_Device::surface();
      pFVar6 = Fl_Display_Device::display_device();
      (*(pFVar6->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
      fl_push_no_clip();
      local_70 = (uchar *)0x0;
      fl_mask_bitmap = &local_70;
      cdata = Fl_Image::data(&this->super_Fl_Image);
      fl_draw_pixmap(cdata,0,0,0x38);
      fl_mask_bitmap = (uchar **)0x0;
      if (local_70 != (uchar *)0x0) {
        iVar3 = Fl_Image::w(&this->super_Fl_Image);
        iVar4 = Fl_Image::h(&this->super_Fl_Image);
        FVar7 = fl_create_bitmask(iVar3,iVar4,local_70);
        this->mask_ = (uint)FVar7;
        if (local_70 != (uchar *)0x0) {
          operator_delete__(local_70);
        }
      }
      fl_pop_clip();
      fl_window = (Window)_ss;
      (**(code **)(*(long *)bitmap + 0x18))();
    }
    this_local._4_4_ = 0;
  }
  else {
    if (_sw._4_4_ == 2) {
      Fl_Image::draw_empty(&this->super_Fl_Image,WP_local,HP_local);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Pixmap::prepare(int XP, int YP, int WP, int HP, int &cx, int &cy,
			   int &X, int &Y, int &W, int &H) {
  if (w() < 0) measure();
  int code = start(this, XP, YP, WP, HP, w(), h(), cx, cy, X, Y, W, H);
  if (code) {
    if (code == 2) draw_empty(XP, YP);
    return 1;
  }
  if (!id_) {
#ifdef __APPLE__
    id_ = Fl_Quartz_Graphics_Driver::create_offscreen_with_alpha(w(), h());
#else
    id_ = fl_create_offscreen(w(), h());
#endif
    fl_begin_offscreen((Fl_Offscreen)id_);
#ifndef __APPLE__
    uchar *bitmap = 0;
    fl_mask_bitmap = &bitmap;
#endif
    fl_draw_pixmap(data(), 0, 0, FL_BLACK);
#ifndef __APPLE__
#if defined(WIN32)
    extern UINT win_pixmap_bg_color; // computed by fl_draw_pixmap()
    this->pixmap_bg_color = win_pixmap_bg_color;
#endif
    fl_mask_bitmap = 0;
    if (bitmap) {
      mask_ = fl_create_bitmask(w(), h(), bitmap);
      delete[] bitmap;
    }
#endif
    fl_end_offscreen();
  }
  return 0;
}